

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Output.cpp
# Opt level: O3

void Output::SkipToColumn(size_t column)

{
  size_t sVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  undefined8 *in_FS_OFFSET;
  bool bVar5;
  
  if (*(char *)*in_FS_OFFSET == '\x01') {
    lVar3 = *(long *)*in_FS_OFFSET;
    sVar1 = PAL_wcslen(*(char16_t **)*in_FS_OFFSET);
    uVar4 = sVar1 + lVar3;
  }
  else {
    uVar4 = 0;
  }
  uVar2 = 0;
  if (uVar4 <= *(ulong *)*in_FS_OFFSET) {
    uVar2 = *(ulong *)*in_FS_OFFSET - uVar4;
  }
  lVar3 = column - uVar2;
  bVar5 = lVar3 != 0;
  if (column < uVar2 || !bVar5) {
    Print(L" ");
    return;
  }
  while (bVar5) {
    Print(L" ");
    lVar3 = lVar3 + -1;
    bVar5 = lVar3 != 0;
  }
  return;
}

Assistant:

void
Output::SkipToColumn(size_t column)
{
    size_t columnbias = 0;
    // If we're using a custom alignment and prefix, we want to do this relative to that
    if (usingCustomAlignAndPrefix)
    {
        // If we've already added the alignment and prefix, we need to add the alignment to our column number here
        columnbias = align + wcslen(prefix);
    }
    size_t reference = 0;
    if (Output::s_Column > columnbias)
    {
        reference = Output::s_Column - columnbias;
    }
    if (column <= reference)
    {
        Output::Print(_u(" "));
        return;
    }

    // compute distance to our destination

    size_t dist = column - reference;

    // Print at least one space
    while (dist > 0)
    {
        Output::Print(_u(" "));
        dist--;
    }
}